

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

void __thiscall despot::Adventurer::PrintState(Adventurer *this,State *s,ostream *out)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char buffer [20];
  char acStack_48 [24];
  
  uVar3 = (ulong)(uint)this->size_;
  if (0 < this->size_) {
    uVar5 = 0;
    do {
      iVar2 = (int)uVar3;
      uVar3 = (long)*(int *)(s + 0xc) % (long)iVar2 & 0xffffffff;
      if (uVar5 == iVar2 - 1) {
        if (uVar5 == uVar3) {
          pcVar4 = "T";
        }
        else {
          pcVar4 = "G";
        }
        sprintf(acStack_48,"%s%-2.2d",pcVar4,(long)*(int *)(s + 0xc) / (long)iVar2 & 0xffffffff);
LAB_0010ac2d:
        sVar1 = strlen(acStack_48);
        pcVar4 = acStack_48;
      }
      else {
        if (uVar5 != uVar3) {
          sprintf(acStack_48,"%4.3f ",
                  (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5]);
          goto LAB_0010ac2d;
        }
        sVar1 = 6;
        pcVar4 = "R     ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar1);
      uVar5 = uVar5 + 1;
      uVar3 = (ulong)this->size_;
    } while ((long)uVar5 < (long)uVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Adventurer::PrintState(const State& s, ostream& out) const {
	const AdventurerState& state = static_cast<const AdventurerState&>(s);

	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (state.state_id % size_ == x) {
				sprintf(buffer, "%s%-2.2d", "T", state.state_id / size_);
				out << buffer;
			} else {
				sprintf(buffer, "%s%-2.2d", "G", state.state_id / size_);
				out << buffer;
			}
		} else {
			if (state.state_id % size_ == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}